

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetResxSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *srcs,string *config)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1b0;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1a8;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1a0;
  const_iterator si;
  TagVisitor<ResxTag,_cmGeneratorTarget::ResxData> visitor;
  undefined1 local_80 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  ResxData data;
  string *config_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *srcs_local;
  cmGeneratorTarget *this_local;
  
  data.ResxSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)config;
  ResxData::ResxData((ResxData *)
                     &sourceFiles.
                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
  cmTarget::GetSourceFiles
            (this->Target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80,
             (string *)
             data.ResxSources.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  TagVisitor<ResxTag,_cmGeneratorTarget::ResxData>::TagVisitor
            ((TagVisitor<ResxTag,_cmGeneratorTarget::ResxData> *)&si,this->Target,
             (ResxData *)
             &sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1a8._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
  __gnu_cxx::
  __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  __normal_iterator<cmSourceFile**>
            ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
              *)&local_1a0,&local_1a8);
  while( true ) {
    local_1b0._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
    bVar1 = __gnu_cxx::operator!=(&local_1a0,&local_1b0);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_1a0);
    TagVisitor<ResxTag,_cmGeneratorTarget::ResxData>::Accept
              ((TagVisitor<ResxTag,_cmGeneratorTarget::ResxData> *)&si,*ppcVar2);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_1a0);
  }
  TagVisitor<ResxTag,_cmGeneratorTarget::ResxData>::~TagVisitor
            ((TagVisitor<ResxTag,_cmGeneratorTarget::ResxData> *)&si);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::operator=
            (srcs,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                  &data.ExpectedResxHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ResxData::~ResxData((ResxData *)
                      &sourceFiles.
                       super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmGeneratorTarget
::GetResxSources(std::vector<cmSourceFile const*>& srcs,
                 const std::string& config) const
{
  ResxData data;
  IMPLEMENT_VISIT_IMPL(Resx, COMMA cmGeneratorTarget::ResxData)
  srcs = data.ResxSources;
}